

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_getSubstChars_63(UConverter *converter,char *mySubChar,int8_t *len,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  int8_t *len_local;
  char *mySubChar_local;
  UConverter *converter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if (converter->subCharLen < '\x01') {
      *len = '\0';
    }
    else if (*len < converter->subCharLen) {
      *err = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      memcpy(mySubChar,converter->subChars,(long)converter->subCharLen);
      *len = converter->subCharLen;
    }
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
ucnv_getSubstChars (const UConverter * converter,
                    char *mySubChar,
                    int8_t * len,
                    UErrorCode * err)
{
    if (U_FAILURE (*err))
        return;

    if (converter->subCharLen <= 0) {
        /* Unicode string or empty string from ucnv_setSubstString(). */
        *len = 0;
        return;
    }

    if (*len < converter->subCharLen) /*not enough space in subChars */
    {
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    uprv_memcpy (mySubChar, converter->subChars, converter->subCharLen);   /*fills in the subchars */
    *len = converter->subCharLen; /*store # of bytes copied to buffer */
}